

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

char * __thiscall
QStringConverterICU::fromUtf16(QStringConverterICU *this,char *out,QStringView in,State *state)

{
  void *pvVar1;
  char cVar2;
  int iVar3;
  UConverter *pUVar4;
  State *state_00;
  long in_FS_OFFSET;
  void *context;
  UConverterFromUCallback action;
  char *target;
  UChar_conflict *source;
  UErrorCode err;
  long local_38;
  
  state_00 = (State *)in.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((state_00->field_4).d[0] == (void *)0x0) {
    pUVar4 = createConverterForName((char *)(state_00->field_4).d[1],state_00);
    (state_00->field_4).d[0] = pUVar4;
  }
  pvVar1 = (state_00->field_4).d[0];
  err = U_ZERO_ERROR;
  source = (UChar_conflict *)in.m_size;
  cVar2 = ucnv_getMaxCharSize_70(pvVar1);
  action = (UConverterFromUCallback)&DAT_aaaaaaaaaaaaaaaa;
  context = &DAT_aaaaaaaaaaaaaaaa;
  target = (char *)this;
  ucnv_getFromUCallBack_70(pvVar1,&action,&context);
  if ((State *)context != state_00) {
    ucnv_setFromUCallBack_70(pvVar1,action,state_00,0,0,&err);
  }
  ucnv_fromUnicode_70(pvVar1,&target,
                      (long)&(this->super_QStringConverter).iface +
                      ((((long)out << 0x20) + 0xa00000000) * (long)cVar2 >> 0x20),&source,
                      (UChar_conflict *)in.m_size + (long)out,0,0,&err);
  if (((state_00->flags).super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
       super_QFlagsStorage<QStringConverterBase::Flag>.i & 1) != 0) {
    iVar3 = ucnv_fromUCountPending_70(pvVar1,&err);
    if (iVar3 != 0) {
      ucnv_reset_70(pvVar1);
      state_00->invalidChars = state_00->invalidChars + (long)iVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return target;
  }
  __stack_chk_fail();
}

Assistant:

static char *fromUtf16(char *out, QStringView in, QStringConverter::State *state)
    {
        QT_COM_THREAD_INIT
        ensureConverter(state);
        auto icu_conv = static_cast<UConverter *>(state->d[0]);
        UErrorCode err = U_ZERO_ERROR;
        auto source = reinterpret_cast<const UChar *>(in.data());
        auto sourceLimit = reinterpret_cast<const UChar *>(in.data() + in.size());

        qsizetype length = UCNV_GET_MAX_BYTES_FOR_STRING(in.size(), ucnv_getMaxCharSize(icu_conv));

        char *target = out;
        char *targetLimit = out + length;
        UBool flush = false;

        // If the QStringConverter was moved, the state that we used as a context is stale now.
        UConverterFromUCallback action;
        const void *context;
        ucnv_getFromUCallBack(icu_conv, &action, &context);
        if (context != state)
             ucnv_setFromUCallBack(icu_conv, action, state, nullptr, nullptr, &err);

        ucnv_fromUnicode(icu_conv, &target, targetLimit, &source, sourceLimit, nullptr, flush, &err);
        // We did reserve enough space:
        Q_ASSERT(err != U_BUFFER_OVERFLOW_ERROR);
        if (state->flags.testFlag(QStringConverter::Flag::Stateless)) {
            if (auto leftOver = ucnv_fromUCountPending(icu_conv, &err)) {
                ucnv_reset(icu_conv);
                state->invalidChars += leftOver;
            }
        }
        return target;
    }